

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_filter.cpp
# Opt level: O3

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::InFilter::Copy(InFilter *this)

{
  InFilter *this_00;
  long in_RSI;
  vector<duckdb::Value,_true> local_30;
  
  this_00 = (InFilter *)operator_new(0x28);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_30,
             (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)(in_RSI + 0x10));
  InFilter(this_00,&local_30);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_30);
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)this_00;
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> InFilter::Copy() const {
	return make_uniq<InFilter>(values);
}